

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memjrnlClose(sqlite3_file *pJfd)

{
  sqlite3_file *pJfd_local;
  
  memjrnlTruncate(pJfd,0);
  return 0;
}

Assistant:

static int memjrnlClose(sqlite3_file *pJfd){
  memjrnlTruncate(pJfd, 0);
  return SQLITE_OK;
}